

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopFusionPass::ProcessFunction(LoopFusionPass *this,Function *function)

{
  NodePtr l2;
  NodePtr l1;
  NodePtr pLVar1;
  bool bVar2;
  bool bVar3;
  LoopDescriptor *this_00;
  Loop *loop_0;
  Loop *top_node;
  LoopFusion fusion;
  RegionRegisterLiveness local_260;
  iterator __end3;
  RegisterLiveness liveness;
  iterator __begin3;
  iterator __begin2;
  iterator __end2;
  
  this_00 = IRContext::GetLoopDescriptor((this->super_Pass).context_,function);
  bVar2 = LoopDescriptor::CreatePreHeaderBlocksIfMissing(this_00);
  top_node = &this_00->placeholder_top_loop_;
  PostOrderTreeDFIterator<spvtools::opt::Loop>::PostOrderTreeDFIterator(&__begin2,top_node);
  __end2.current_ = top_node;
  std::
  stack<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>>
  ::
  stack<std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>,void>
            (&__end2.parent_iterators_);
  do {
    pLVar1 = __end2.current_;
    l1 = __begin2.current_;
    if (__begin2.current_ == __end2.current_) {
LAB_00213869:
      std::
      _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                      *)&__end2.parent_iterators_);
      std::
      _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                      *)&__begin2.parent_iterators_);
      return bVar2 || l1 != pLVar1;
    }
    PostOrderTreeDFIterator<spvtools::opt::Loop>::PostOrderTreeDFIterator(&__begin3,top_node);
    __end3.current_ = top_node;
    std::
    stack<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>>
    ::
    stack<std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>,void>
              (&__end3.parent_iterators_);
    while (l2 = __begin3.current_, __begin3.current_ != __end3.current_) {
      fusion.context_ = (this->super_Pass).context_;
      fusion.loop_0_ = l1;
      fusion.loop_1_ = __begin3.current_;
      fusion.containing_function_ = l1->loop_header_->function_;
      fusion.induction_0_ = (Instruction *)0x0;
      fusion.induction_1_ = (Instruction *)0x0;
      bVar3 = LoopFusion::AreCompatible(&fusion);
      if (bVar3) {
        bVar3 = LoopFusion::IsLegal(&fusion);
        if (bVar3) {
          RegisterLiveness::RegisterLiveness(&liveness,(this->super_Pass).context_,function);
          local_260.live_in_._M_h._M_buckets = &local_260.live_in_._M_h._M_single_bucket;
          local_260.live_in_._M_h._M_bucket_count = 1;
          local_260.live_in_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_260.live_in_._M_h._M_element_count = 0;
          local_260.live_in_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_260.live_in_._M_h._M_rehash_policy._4_4_ = 0;
          local_260.live_in_._M_h._M_rehash_policy._M_next_resize = 0;
          local_260.live_in_._M_h._M_single_bucket = (__node_base_ptr)0x0;
          local_260.live_out_._M_h._M_buckets = &local_260.live_out_._M_h._M_single_bucket;
          local_260.live_out_._M_h._M_bucket_count = 1;
          local_260.live_out_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_260.live_out_._M_h._M_element_count = 0;
          local_260.live_out_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_260.live_out_._M_h._M_rehash_policy._4_4_ = 0;
          local_260.registers_classes_.
          super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_260.registers_classes_.
          super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_260.used_registers_ = 0;
          local_260.registers_classes_.
          super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_260.live_out_._M_h._M_rehash_policy._M_next_resize = 0;
          local_260.live_out_._M_h._M_single_bucket = (__node_base_ptr)0x0;
          RegisterLiveness::SimulateFusion(&liveness,l1,l2,&local_260);
          if (local_260.used_registers_ <= this->max_registers_per_loop_) {
            LoopFusion::Fuse(&fusion);
            ProcessFunction(this,function);
            RegisterLiveness::RegionRegisterLiveness::~RegionRegisterLiveness(&local_260);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&liveness.block_pressure_._M_h);
            std::
            _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
            ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                            *)&__end3.parent_iterators_);
            std::
            _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
            ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                            *)&__begin3.parent_iterators_);
            goto LAB_00213869;
          }
          RegisterLiveness::RegionRegisterLiveness::~RegionRegisterLiveness(&local_260);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&liveness.block_pressure_._M_h);
        }
      }
      PostOrderTreeDFIterator<spvtools::opt::Loop>::MoveToNextNode(&__begin3);
    }
    std::
    _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                    *)&__end3.parent_iterators_);
    std::
    _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                    *)&__begin3.parent_iterators_);
    PostOrderTreeDFIterator<spvtools::opt::Loop>::MoveToNextNode(&__begin2);
  } while( true );
}

Assistant:

bool LoopFusionPass::ProcessFunction(Function* function) {
  LoopDescriptor& ld = *context()->GetLoopDescriptor(function);

  // If a loop doesn't have a preheader needs then it needs to be created. Make
  // sure to return Status::SuccessWithChange in that case.
  auto modified = ld.CreatePreHeaderBlocksIfMissing();

  // TODO(tremmelg): Could the only loop that |loop| could possibly be fused be
  // picked out so don't have to check every loop
  for (auto& loop_0 : ld) {
    for (auto& loop_1 : ld) {
      LoopFusion fusion(context(), &loop_0, &loop_1);

      if (fusion.AreCompatible() && fusion.IsLegal()) {
        RegisterLiveness liveness(context(), function);
        RegisterLiveness::RegionRegisterLiveness reg_pressure{};
        liveness.SimulateFusion(loop_0, loop_1, &reg_pressure);

        if (reg_pressure.used_registers_ <= max_registers_per_loop_) {
          fusion.Fuse();
          // Recurse, as the current iterators will have been invalidated.
          ProcessFunction(function);
          return true;
        }
      }
    }
  }

  return modified;
}